

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O2

econf_err setKey(econf_file *key_file,size_t num,char *value)

{
  char *pcVar1;
  
  if (value == (char *)0x0 || key_file == (econf_file *)0x0) {
    return ECONF_ERROR;
  }
  free(key_file->file_entry[num].key);
  pcVar1 = strdup(value);
  key_file->file_entry[num].key = pcVar1;
  return (uint)(pcVar1 == (char *)0x0) * 2;
}

Assistant:

econf_err setKey(econf_file *key_file, size_t num, const char *value) {
  if (key_file == NULL || value == NULL)
    return ECONF_ERROR;
  if (key_file->file_entry[num].key)
    free(key_file->file_entry[num].key);
  key_file->file_entry[num].key = strdup(value);
  if (key_file->file_entry[num].key == NULL)
    return ECONF_NOMEM;

  return ECONF_SUCCESS;
}